

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::BeginElemSegment
          (BinaryReaderInterp *this,Index index,Index table_index,uint8_t flags)

{
  SegmentMode index_00;
  bool bVar1;
  Type local_dc;
  undefined1 local_d8 [8];
  ElemDesc desc;
  Var local_78;
  Enum local_2c;
  SegmentMode local_28;
  uint8_t local_21;
  SegmentMode mode;
  Index IStack_1c;
  uint8_t flags_local;
  Index table_index_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  
  local_21 = flags;
  mode = table_index;
  IStack_1c = index;
  _table_index_local = this;
  local_28 = ToSegmentMode(flags);
  index_00 = mode;
  Location::Location((Location *)((long)&desc.offset.field_1 + 8));
  Var::Var(&local_78,index_00,(Location *)((long)&desc.offset.field_1 + 8));
  local_2c = (Enum)SharedValidator::OnElemSegment
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,&local_78,
                              local_28);
  bVar1 = Failed((Result)local_2c);
  Var::~Var(&local_78);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    ElemDesc::ElemDesc((ElemDesc *)local_d8);
    Type::Type(&local_dc,Void);
    desc.elements.
    super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = local_dc.enum_;
    desc.elements.
    super__Vector_base<wabt::interp::ElemExpr,_std::allocator<wabt::interp::ElemExpr>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = local_28;
    desc.type.enum_ = mode;
    std::vector<wabt::interp::ElemDesc,_std::allocator<wabt::interp::ElemDesc>_>::push_back
              (&this->module_->elems,(value_type *)local_d8);
    (this->init_expr_).kind = None;
    Result::Result((Result *)((long)&this_local + 4),Ok);
    ElemDesc::~ElemDesc((ElemDesc *)local_d8);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderInterp::BeginElemSegment(Index index,
                                            Index table_index,
                                            uint8_t flags) {
  auto mode = ToSegmentMode(flags);
  CHECK_RESULT(validator_.OnElemSegment(loc, Var(table_index), mode));

  ElemDesc desc;
  desc.type = ValueType::Void;  // Initialized later in OnElemSegmentElemType.
  desc.mode = mode;
  desc.table_index = table_index;
  module_.elems.push_back(desc);
  init_expr_.kind = InitExprKind::None;
  return Result::Ok;
}